

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O1

adt_error_t adt_ary_resize(adt_ary_t *self,int32_t s32Len)

{
  adt_error_t aVar1;
  int32_t delta;
  int s32Len_00;
  
  aVar1 = '\x01';
  if (-1 < s32Len && self != (adt_ary_t *)0x0) {
    aVar1 = adt_ary_fill(self,s32Len);
    if ((aVar1 == '\0') &&
       (s32Len_00 = self->s32CurLen - s32Len, s32Len_00 != 0 && s32Len <= self->s32CurLen)) {
      aVar1 = adt_ary_splice(self,s32Len,s32Len_00);
      return aVar1;
    }
  }
  return aVar1;
}

Assistant:

adt_error_t adt_ary_resize(adt_ary_t *self, int32_t s32Len)
{
   if ( (self != 0) && (s32Len >= 0) ) {
      adt_error_t result = adt_ary_fill(self,s32Len);
      if (result != ADT_NO_ERROR) {
         return result;
      }
      if (s32Len < self->s32CurLen) {
         int32_t delta = self->s32CurLen-s32Len;
         result = adt_ary_splice(self,s32Len,delta);
      }
      return result;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}